

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

void __thiscall CKey::MakeNewKey(CKey *this,bool fCompressedIn)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MakeKeyData(this);
  do {
    bytes.m_size = 0x20;
    bytes.m_data = ((this->keydata)._M_t.
                    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)->
                   _M_elems;
    GetStrongRandBytes(bytes);
    bVar2 = Check(((this->keydata)._M_t.
                   super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)->
                  _M_elems);
  } while (!bVar2);
  this->fCompressed = fCompressedIn;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CKey::MakeNewKey(bool fCompressedIn) {
    MakeKeyData();
    do {
        GetStrongRandBytes(*keydata);
    } while (!Check(keydata->data()));
    fCompressed = fCompressedIn;
}